

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.h
# Opt level: O0

CategoricalMapping * __thiscall
CoreML::Specification::Model::mutable_categoricalmapping(Model *this)

{
  bool bVar1;
  CategoricalMapping *this_00;
  Model *this_local;
  
  bVar1 = has_categoricalmapping(this);
  if (!bVar1) {
    clear_Type(this);
    set_has_categoricalmapping(this);
    this_00 = (CategoricalMapping *)operator_new(0x30);
    CategoricalMapping::CategoricalMapping(this_00);
    (this->Type_).categoricalmapping_ = this_00;
  }
  return (CategoricalMapping *)(this->Type_).pipelineclassifier_;
}

Assistant:

inline ::CoreML::Specification::CategoricalMapping* Model::mutable_categoricalmapping() {
  if (!has_categoricalmapping()) {
    clear_Type();
    set_has_categoricalmapping();
    Type_.categoricalmapping_ = new ::CoreML::Specification::CategoricalMapping;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.Model.categoricalMapping)
  return Type_.categoricalmapping_;
}